

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncLogging.cc
# Opt level: O3

void __thiscall
tt::AsyncLogging::AsyncLogging(AsyncLogging *this,string *basename,int flushInterval)

{
  pointer pcVar1;
  FixedBuffer<4000000> *pFVar2;
  string local_a0;
  string *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  Thread *local_70;
  CountDownLatch *local_68;
  pthread_cond_t *local_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  this->m_flushInterval = flushInterval;
  this->m_running = false;
  local_78 = &(this->m_basename).field_2;
  (this->m_basename)._M_dataplus._M_p = (pointer)local_78;
  pcVar1 = (basename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_basename,pcVar1,pcVar1 + basename->_M_string_length);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_80 = &this->m_basename;
  local_58._M_unused._M_object = operator_new(0x18);
  *(code **)local_58._M_unused._0_8_ = threadFunc;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(AsyncLogging **)((long)local_58._M_unused._0_8_ + 0x10) = this;
  pcStack_40 = std::
               _Function_handler<void_(),_std::_Bind<void_(tt::AsyncLogging::*(tt::AsyncLogging_*))()>_>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_std::_Bind<void_(tt::AsyncLogging::*(tt::AsyncLogging_*))()>_>
             ::_M_manager;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Logging","");
  local_70 = &this->m_thread;
  Thread::Thread(local_70,(ThreadFunc *)&local_58,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  local_68 = &this->m_latch;
  CountDownLatch::CountDownLatch(local_68,1);
  pthread_mutex_init((pthread_mutex_t *)&this->m_mutex,(pthread_mutexattr_t *)0x0);
  (this->m_cond).m_mutex = &this->m_mutex;
  local_60 = &(this->m_cond).m_cond;
  pthread_cond_init((pthread_cond_t *)local_60,(pthread_condattr_t *)0x0);
  pFVar2 = (FixedBuffer<4000000> *)operator_new(0x3d0908);
  pFVar2->m_cur = (char *)pFVar2;
  (this->m_currentBuffer).
  super___shared_ptr<tt::detail::FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pFVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<tt::detail::FixedBuffer<4000000>*>
            (&(this->m_currentBuffer).
              super___shared_ptr<tt::detail::FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,pFVar2);
  pFVar2 = (FixedBuffer<4000000> *)operator_new(0x3d0908);
  pFVar2->m_cur = (char *)pFVar2;
  (this->m_nextBuffer).
  super___shared_ptr<tt::detail::FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pFVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<tt::detail::FixedBuffer<4000000>*>
            (&(this->m_nextBuffer).
              super___shared_ptr<tt::detail::FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,pFVar2);
  (this->m_buffers).
  super__Vector_base<std::shared_ptr<tt::detail::FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<tt::detail::FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_buffers).
  super__Vector_base<std::shared_ptr<tt::detail::FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<tt::detail::FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_buffers).
  super__Vector_base<std::shared_ptr<tt::detail::FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<tt::detail::FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (1 < basename->_M_string_length) {
    memset((this->m_currentBuffer).
           super___shared_ptr<tt::detail::FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0
           ,4000000);
    memset((this->m_nextBuffer).
           super___shared_ptr<tt::detail::FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0
           ,4000000);
    std::
    vector<std::shared_ptr<tt::detail::FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<tt::detail::FixedBuffer<4000000>_>_>_>
    ::reserve(&this->m_buffers,0x10);
    return;
  }
  __assert_fail("basename.size() > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/HhTtLllL[P]web_server/h_webserver/base/AsyncLogging.cc"
                ,0x16,"tt::AsyncLogging::AsyncLogging(const std::string &, int)");
}

Assistant:

AsyncLogging::AsyncLogging(const std::string& basename, int flushInterval)
	:m_flushInterval(flushInterval),
	m_running(false),
	m_basename(basename),
	m_thread(std::bind(&AsyncLogging::threadFunc,this),"Logging"),
	m_latch(1),
	m_mutex(),
	m_cond(m_mutex),
	m_currentBuffer(new Buffer),
	m_nextBuffer(new Buffer),
	m_buffers(){

		assert(basename.size() > 1);

		m_currentBuffer->bzero();
		m_nextBuffer->bzero();
		m_buffers.reserve(16);

}